

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

void luaL_where(lua_State *L,int level)

{
  int iVar1;
  lua_Debug ar;
  lua_Debug local_90;
  
  iVar1 = lua_getstack(L,level,&local_90);
  if ((iVar1 != 0) && (lua_getinfo(L,"Sl",&local_90), 0 < local_90.currentline)) {
    lua_pushfstring(L,"%s:%d: ",local_90.short_src);
    return;
  }
  lua_pushfstring(L,"");
  return;
}

Assistant:

LUALIB_API void luaL_where(lua_State *L, int level) {
    lua_Debug ar;
    if (lua_getstack(L, level, &ar)) {  /* check function at level */
        lua_getinfo(L, "Sl", &ar);  /* get info about it */
        if (ar.currentline > 0) {  /* is there info? */
            lua_pushfstring(L, "%s:%d: ", ar.short_src, ar.currentline);
            return;
        }
    }
    lua_pushfstring(L, "");  /* else, no information available... */
}